

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O1

ArchKind llvm::AArch64::parseArch(StringRef Arch)

{
  ArchKind AVar1;
  ulong uVar2;
  int iVar3;
  size_t in_RDX;
  ulong __n;
  long lVar4;
  bool bVar5;
  StringRef SVar6;
  
  SVar6.Data = (char *)Arch.Length;
  SVar6.Length = in_RDX;
  SVar6 = ARM::getCanonicalArchName((ARM *)Arch.Data,SVar6);
  if (((1 < SVar6.Length) && (*SVar6.Data == 'v')) && (0xfffffffd < (int)SVar6.Data[1] - 0x3aU)) {
    SVar6 = getArchSynonym(SVar6);
    __n = SVar6.Length;
    lVar4 = 0;
    do {
      uVar2 = *(ulong *)(&DAT_001e9f08 + lVar4);
      AVar1 = *(ArchKind *)(&DAT_001e9f38 + lVar4);
      bVar5 = __n <= uVar2;
      if (__n - 1 < uVar2) {
        iVar3 = bcmp((void *)((uVar2 + *(long *)((long)&(anonymous_namespace)::AArch64ARCHNames +
                                                lVar4)) - __n),SVar6.Data,__n);
        bVar5 = iVar3 == 0;
      }
      if (bVar5) {
        return AVar1;
      }
      lVar4 = lVar4 + 0x40;
    } while (lVar4 != 0x180);
  }
  return INVALID;
}

Assistant:

StringRef llvm::AArch64::getCanonicalArchName(StringRef Arch) {
  return ARM::getCanonicalArchName(Arch);
}